

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_ar.c
# Opt level: O3

ssize_t archive_write_ar_data(archive_write *a,void *buff,size_t s)

{
  ulong *puVar1;
  int iVar2;
  void *__dest;
  
  puVar1 = (ulong *)a->format_data;
  if (*puVar1 < s) {
    s = *puVar1;
  }
  if (0 < (int)puVar1[2]) {
    if (0 < *(int *)((long)puVar1 + 0x14)) {
      archive_set_error(&a->archive,0x16,"More than one string tables exist");
      return -0x14;
    }
    __dest = malloc(s + 1);
    puVar1[4] = (ulong)__dest;
    if (__dest == (void *)0x0) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate strtab buffer");
      return -0x1e;
    }
    memcpy(__dest,buff,s);
    *(undefined1 *)((long)__dest + s) = 0;
    *(undefined4 *)((long)puVar1 + 0x14) = 1;
  }
  iVar2 = __archive_write_output(a,buff,s);
  if (iVar2 == 0) {
    *puVar1 = *puVar1 - s;
  }
  else {
    s = (size_t)iVar2;
  }
  return s;
}

Assistant:

static ssize_t
archive_write_ar_data(struct archive_write *a, const void *buff, size_t s)
{
	struct ar_w *ar;
	int ret;

	ar = (struct ar_w *)a->format_data;
	if (s > ar->entry_bytes_remaining)
		s = (size_t)ar->entry_bytes_remaining;

	if (ar->is_strtab > 0) {
		if (ar->has_strtab > 0) {
			archive_set_error(&a->archive, EINVAL,
			    "More than one string tables exist");
			return (ARCHIVE_WARN);
		}

		ar->strtab = malloc(s + 1);
		if (ar->strtab == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate strtab buffer");
			return (ARCHIVE_FATAL);
		}
		memcpy(ar->strtab, buff, s);
		ar->strtab[s] = '\0';
		ar->has_strtab = 1;
	}

	ret = __archive_write_output(a, buff, s);
	if (ret != ARCHIVE_OK)
		return (ret);

	ar->entry_bytes_remaining -= s;
	return (s);
}